

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candidate_index_impl.h
# Opt level: O2

void __thiscall
candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
          *sets_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int number_of_labels,double distance_threshold)

{
  LabelSetElement *sv_r;
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  CandidateIndex *this_00;
  pointer piVar4;
  pointer ppVar5;
  ulong uVar6;
  long lVar7;
  int distance_threshold_00;
  int iVar8;
  int *piVar9;
  vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
  *pvVar10;
  pointer pSVar11;
  pointer pLVar12;
  int *piVar13;
  size_t s;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  pointer pIVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  int set;
  int iStack_fc;
  int r_id;
  double local_f0;
  double local_e8;
  int *local_e0;
  vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
  *local_d8;
  int local_cc;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  r;
  vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_> set_data;
  vector<int,_std::allocator<int>_> M;
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  il_index;
  
  local_e8 = distance_threshold;
  std::
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  ::vector(&il_index,(long)number_of_labels,(allocator_type *)&set_data);
  std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::vector
            (&set_data,
             (long)(sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&r);
  ppVar5 = (sets_collection->
           super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dVar20 = local_e8 + 1.0;
  distance_threshold_00 = (int)local_e8;
  local_d8 = sets_collection;
  do {
    pvVar10 = local_d8;
    if (ppVar5 == (local_d8->
                  super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
      ~_Vector_base(&set_data.
                     super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                   );
      std::
      vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
      ::~vector(&il_index);
      return;
    }
    std::
    vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
    ::vector(&r,&ppVar5->second);
    ppVar1 = (pvVar10->
             super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)((long)ppVar5 - (long)ppVar1) >> 5;
    r_id = (int)uVar6;
    M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_cc = ppVar1[r_id].first;
    local_f0 = (double)local_cc;
    if (local_f0 <= local_e8) {
      iVar8 = 0;
      while( true ) {
        set = iVar8;
        if ((int)uVar6 <= iVar8) break;
        lVar7 = (long)iVar8;
        iVar8 = set_data.
                super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar7].overlap;
        if (iVar8 == 0) {
          std::vector<int,_std::allocator<int>_>::push_back(&M,&set);
          lVar7 = (long)set;
          iVar8 = set_data.
                  super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar7].overlap;
        }
        set_data.
        super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar7].overlap = iVar8 + 1;
        iVar8 = set + 1;
        uVar6 = (ulong)(uint)r_id;
      }
    }
    local_f0 = local_f0 - local_e8;
    piVar13 = (int *)0x0;
    pLVar12 = r.
              super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((int *)(((long)r.
                         super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar12) / 0x28) <=
          piVar13) break;
      uVar6 = (ulong)pLVar12[(long)piVar13].id;
      uVar14 = (ulong)il_index.
                      super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].offset;
      ppVar2 = il_index.
               super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].element_list.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar3 = il_index.
               super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].element_list.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ppVar1 = (pvVar10->
               super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      while ((pIVar17 = il_index.
                        super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                        ._M_impl.super__Vector_impl_data._M_start, local_e0 = piVar13,
             uVar14 < (ulong)((long)ppVar3 - (long)ppVar2 >> 3) &&
             ((double)ppVar1[ppVar2[uVar14].first].first < local_f0))) {
        uVar14 = uVar14 + 1;
        il_index.
        super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar6].offset = (int)uVar14;
      }
      while( true ) {
        sv_r = pLVar12 + (long)piVar13;
        ppVar2 = pIVar17[(int)uVar6].element_list.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)pIVar17[(int)uVar6].element_list.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3) <= uVar14)
        break;
        iVar8 = ppVar2[uVar14].first;
        lVar7 = (long)iVar8;
        set = iVar8;
        iVar8 = pIVar17[sv_r->id].element_list.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar14].second;
        this->il_lookups_ = this->il_lookups_ + 1;
        iVar8 = structural_mapping((CandidateIndex *)(lVar7 * 0x20),sv_r,
                                   (LabelSetElement *)
                                   ((long)iVar8 * 0x28 +
                                   *(long *)((long)&((CandidateIndex *)(lVar7 * 0x20))->il_lookups_
                                            + (long)(pvVar10->
                                                                                                        
                                                  super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)),
                                   local_e8);
        if ((iVar8 != 0) &&
           (set_data.
            super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7].overlap == 0)) {
          std::vector<int,_std::allocator<int>_>::push_back(&M,&set);
          lVar7 = (long)set;
          pLVar12 = r.
                    super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar17 = il_index.
                    super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        set_data.
        super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar7].overlap =
             set_data.
             super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar7].overlap + iVar8;
        uVar14 = uVar14 + 1;
        uVar6 = (ulong)(uint)pLVar12[(long)piVar13].id;
        pvVar10 = local_d8;
      }
      piVar13 = (int *)((long)local_e0 + 1);
    } while ((double)sv_r->weight_so_far <= dVar20);
    set_data.super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
    ._M_impl.super__Vector_impl_data._M_start[r_id].prefix = (int)piVar13;
    this->pre_candidates_ =
         this->pre_candidates_ +
         ((long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start >> 2);
    lVar15 = 0;
    lVar18 = 0;
    for (lVar7 = 0;
        piVar4 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish,
        piVar13 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start,
        pSVar11 = set_data.
                  super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar7 < set_data.
                super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                ._M_impl.super__Vector_impl_data._M_start[r_id].prefix; lVar7 = lVar7 + 1) {
      _set = (pair<int,_int>)((ulong)(uint)r_id + lVar15);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 &il_index.
                  super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)&(r.
                                    super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->id + lVar18)].
                  element_list,(pair<int,_int> *)&set);
      lVar18 = lVar18 + 0x28;
      lVar15 = lVar15 + 0x100000000;
    }
    while (piVar13 != piVar4) {
      lVar15 = (long)*piVar13;
      set = *piVar13;
      ppVar1 = (local_d8->
               super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (ulong)pSVar11[r_id].prefix;
      lVar7 = (long)pSVar11[lVar15].prefix;
      this_00 = *(CandidateIndex **)
                 &ppVar1[lVar15].second.
                  super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ._M_impl;
      if (*(int *)((long)this_00 + lVar7 * 0x28 + -0x28) <
          r.
          super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar6 - 1].id) {
        iVar8 = pSVar11[lVar15].overlap;
        piVar9 = &(r.
                   super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                   ._M_impl.super__Vector_impl_data._M_start)->weight_so_far;
        uVar14 = 0;
        do {
          uVar6 = uVar14 + 1;
          if (iVar8 <= *piVar9) break;
          piVar9 = piVar9 + 10;
          bVar19 = uVar14 < (ulong)(((long)r.
                                           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)r.
                                          super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0x28);
          uVar14 = uVar6;
        } while (bVar19);
      }
      else {
        iVar8 = pSVar11[lVar15].overlap;
        plVar16 = &this_00->il_lookups_;
        for (lVar7 = 1;
            ((int)*plVar16 < iVar8 &&
            (lVar7 - 1U <
             (ulong)(((long)*(pointer *)
                             ((long)&ppVar1[lVar15].second.
                                     super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                     ._M_impl + 8) - (long)this_00) / 0x28))); lVar7 = lVar7 + 1) {
          plVar16 = plVar16 + 5;
        }
      }
      local_e0 = piVar13;
      bVar19 = structural_filter(this_00,&r,&ppVar1[lVar15].second,local_f0,iVar8,(int)uVar6,
                                 (int)lVar7,distance_threshold_00,
                                 (local_cc -
                                 r.
                                 super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar6 - 1].weight_so_far)
                                 + iVar8,(ppVar1[lVar15].first + iVar8) -
                                         *(int *)((long)this_00 + lVar7 * 0x28 + -0x20));
      if (bVar19) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates,
                   &r_id,&set);
        lVar15 = (long)set;
        pSVar11 = set_data.
                  super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      pSVar11[lVar15].overlap = 0;
      piVar13 = local_e0 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&M.super__Vector_base<int,_std::allocator<int>_>);
    std::
    vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
    ::~vector(&r);
    ppVar5 = ppVar5 + 1;
  } while( true );
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>& sets_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int number_of_labels, 
    const double distance_threshold) {
  // inverted list index.
  std::vector<candidate_index::InvertedListElement> il_index(number_of_labels);
  // containing specific data of a set. (e.g. actual overlap, index prefix)
  std::vector<candidate_index::SetData> set_data(sets_collection.size());
  // position in label set while processing r
  std::size_t p = 0;

  // iterate through all sets in the given collection
  std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>::iterator r_it = sets_collection.begin();
  for (; r_it != sets_collection.end(); ++r_it) {
    std::pair<int, std::vector<label_set_converter::LabelSetElement>>& r_pair = *r_it; // dereference iterator to current set once
    std::vector<label_set_converter::LabelSetElement> r = r_pair.second; // dereference iterator to current set once
    int r_id = r_it - sets_collection.begin(); // identifier for r (line number)
    std::vector<int> M; // holds the set identifiers of the candidate pairs, 
                                 // the overlap is stored in the set_data
    int r_size = sets_collection[r_id].first; // number of elements in r

    // *****************************
    // ** Generate pre candidates **
    // *****************************
    // add all small trees that does not have to share a common label in the prefix
    if(r_size <= distance_threshold) 
      for(int i = 0; i < r_id; ++i) {
        if(set_data[i].overlap == 0) 
          M.push_back(i); // if not, add it to the candidate set M
        ++set_data[i].overlap; // increase overlap for set i
      }

    // iterate through probing prefix elements and extend the candidate set
    p = 0;
    // until tau + 1 nodes of the probing set are processed
    while(p < r.size()) {
      // remove all entries in the inverted list index up to the position where 
      // the size is greater than the lower bound
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size() &&
          sets_collection[il_index[r[p].id].element_list[s].first].first < r_size - distance_threshold; s++)
        ++il_index[r[p].id].offset;

      // iterate through all remaining sets for the current token r[p] in the 
      // inverted list index and add them to the candidates
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size(); s++) {
        int set = il_index[r[p].id].element_list[s].first;
        int pos = il_index[r[p].id].element_list[s].second;
        // increase the number of lookups in the inverted list
        ++il_lookups_;

        int tau_valid = structural_mapping(r[p], sets_collection[set].second[pos], distance_threshold);
        if(tau_valid != 0 && set_data[set].overlap == 0) 
          M.push_back(set); // if not, add it to the candidate set M
        set_data[set].overlap += tau_valid;
        
      }
      // stop as soon as tau + 1 elements have been discovered
      p++;
      if(r[p-1].weight_so_far > distance_threshold + 1)
        break;
    }

    // store last postition of the index of the label set
    set_data[r_id].prefix = p;
    // count number of precandidates
    pre_candidates_ += M.size();
    
    // add all elements in the prefix of r in the inverted list
    for(int p = 0; p < set_data[r_id].prefix; p++)
      il_index[r[p].id].element_list.push_back(std::make_pair(r_id, p));

    // *****************************
    // *** Verify pre candidates ***
    // *****************************
    // compute structural filter for each candidate (r, s) in M
    for (int m: M) {
      std::vector<label_set_converter::LabelSetElement>& s = sets_collection[m].second;
      // prefix positions for sets r and s in the candidate pair
      std::size_t pr = 0, ps = 0;

      // check last prefix position; the smaller one starts at prefix position, 
      // the greater one starts at the overlap
      if (r[set_data[r_id].prefix-1].id > s[set_data[m].prefix-1].id) {
        for(; r[pr].weight_so_far < set_data[m].overlap && pr < r.size(); ++pr) {}
        ++pr;
        ps = set_data[m].prefix;
      } else {
        pr = set_data[r_id].prefix;
        for(; s[ps].weight_so_far < set_data[m].overlap && ps < s.size(); ++ps) {}
        ++ps;
      }

      int maxr = r_size - r[pr-1].weight_so_far + set_data[m].overlap;
      int maxs = sets_collection[m].first - s[ps-1].weight_so_far + set_data[m].overlap;

      // overlap needed for threshold tau between r and s
      const double eqoverlap = r_size - distance_threshold;

      // verify if r and s belong to the resultset, computed the structural filter
      if (structural_filter(r, s, eqoverlap, set_data[m].overlap, pr, ps, distance_threshold, maxr, maxs))
        join_candidates.emplace_back(r_id, m);

      // reset overlap in set_data
      set_data[m].overlap = 0;
    }
  }
}